

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceType what,string_view key,
          string_view type,string_view units)

{
  size_type sVar1;
  _Elt_pointer pBVar2;
  string actKey;
  InterfaceType local_62;
  allocator<char> local_61;
  InterfaceHandle local_60;
  GlobalFederateId local_5c;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  
  local_58._M_str = key._M_str;
  local_62 = what;
  local_5c.gid = fed_id.gid;
  local_58._M_len = key._M_len;
  sVar1 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    (&this->handles);
  local_60.hid = (BaseType)sVar1;
  if (key._M_len == 0) {
    generateName_abi_cxx11_(&local_48,this,what);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_48,&local_58,&local_61);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle_const&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>> *)this,
             &local_5c,&local_60,&local_62,&local_48,&type,&units);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  addSearchFields(this,pBVar2 + -1,local_60.hid);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return pBVar2 + -1;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    const InterfaceHandle local_id(static_cast<InterfaceHandle::BaseType>(handles.size()));
    const std::string actKey = (!key.empty()) ? std::string(key) : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), local_id.baseValue());
    return handles.back();
}